

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O2

TA_RetCode
CallTestFunction(RangeTestFunction testFunction,TA_Integer startIdx,TA_Integer endIdx,
                TA_Real *outputBuffer,TA_Integer *outputBufferInt,TA_Integer *outBegIdx,
                TA_Integer *outNbElement,TA_Integer *lookback,void *opaqueData,uint outputNb,
                uint *isOutputInteger)

{
  TA_RetCode TVar1;
  clock_t cVar2;
  clock_t cVar3;
  double dVar4;
  
  cVar2 = clock();
  TVar1 = (*testFunction)(startIdx,endIdx,outputBuffer,outputBufferInt,outBegIdx,outNbElement,
                          lookback,opaqueData,outputNb,isOutputInteger);
  if (0x13 < *outNbElement) {
    cVar3 = clock();
    if (cVar3 - cVar2 < 1) {
      insufficientClockPrecision = 1;
    }
    else {
      dVar4 = (double)(cVar3 - cVar2);
      if (worstProfiledCall < dVar4) {
        worstProfiledCall = dVar4;
      }
      timeInProfiledCall = dVar4 + timeInProfiledCall;
      nbProfiledCall = nbProfiledCall + 1;
    }
  }
  return TVar1;
}

Assistant:

static TA_RetCode CallTestFunction( RangeTestFunction testFunction,
                                    TA_Integer    startIdx,
                                    TA_Integer    endIdx,
                                    TA_Real      *outputBuffer,
                                    TA_Integer   *outputBufferInt,
                                    TA_Integer   *outBegIdx,
                                    TA_Integer   *outNbElement,
                                    TA_Integer   *lookback,
                                    void         *opaqueData,
                                    unsigned int  outputNb,
                                    unsigned int *isOutputInteger )
{
   /* Call the function and do profiling. */
   TA_RetCode retCode;
   double clockDelta;

#ifdef WIN32
   LARGE_INTEGER startClock;
   LARGE_INTEGER endClock;
#else
   clock_t startClock;
   clock_t endClock;
#endif

#ifdef WIN32
   QueryPerformanceCounter(&startClock);
#else
   startClock = clock();
#endif
	retCode = testFunction( startIdx,
                  endIdx,
                  outputBuffer,
                  outputBufferInt,
                  outBegIdx,
                  outNbElement,
                  lookback,
                  opaqueData,
                  outputNb,
                  isOutputInteger );

	/* Profile only functions producing at least 20 values. */
	if( *outNbElement < 20 )
	{
		return retCode;
	}

#ifdef WIN32
   QueryPerformanceCounter(&endClock);
   clockDelta = (double)((__int64)endClock.QuadPart - (__int64) startClock.QuadPart);
#else
   endClock = clock();
   clockDelta = (double)(endClock - startClock);
#endif

   if( clockDelta <= 0 )
   {
	   insufficientClockPrecision = 1;
   }
   else
   {
      if( clockDelta > worstProfiledCall )
         worstProfiledCall = clockDelta;
      timeInProfiledCall += clockDelta;
      nbProfiledCall++;
   }

   return retCode;
}